

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall RPCArg::GetFirstName_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this)

{
  long lVar1;
  size_t __n;
  pointer __s;
  void *pvVar2;
  size_type __n_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (this->m_names)._M_string_length;
  if (__n == 0) {
    __n_00 = 0xffffffffffffffff;
  }
  else {
    __s = (this->m_names)._M_dataplus._M_p;
    pvVar2 = memchr(__s,0x7c,__n);
    __n_00 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&this->m_names,0,__n_00);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::GetFirstName() const
{
    return m_names.substr(0, m_names.find('|'));
}